

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-unreachable.c
# Opt level: O1

int run_test_udp_send_unreachable(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  undefined8 uVar2;
  long in_RCX;
  undefined8 *extraout_RDX;
  uv_udp_t *puVar3;
  uv_timer_t *puVar4;
  code *pcVar5;
  uv_udp_t *puVar6;
  undefined1 auVar7 [16];
  sockaddr_in addr;
  sockaddr_in addr2;
  uv_udp_send_t req2;
  uv_udp_send_t req1;
  undefined1 auStack_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [336];
  uv_udp_t local_148;
  
  puVar6 = (uv_udp_t *)0x194b6a;
  puVar3 = (uv_udp_t *)0x23a3;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_2b8);
  if (iVar1 == 0) {
    puVar6 = (uv_udp_t *)0x194b6a;
    puVar3 = (uv_udp_t *)0x23a4;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a4,local_298);
    if (iVar1 != 0) goto LAB_0017c860;
    puVar6 = (uv_udp_t *)uv_default_loop();
    puVar4 = &timer;
    iVar1 = uv_timer_init();
    puVar3 = (uv_udp_t *)puVar4;
    if (iVar1 != 0) goto LAB_0017c865;
    puVar4 = &timer;
    pcVar5 = timer_cb;
    in_RCX = 0;
    iVar1 = uv_timer_start(&timer,timer_cb,1000);
    puVar3 = (uv_udp_t *)pcVar5;
    puVar6 = (uv_udp_t *)puVar4;
    if (iVar1 != 0) goto LAB_0017c86a;
    puVar6 = (uv_udp_t *)uv_default_loop();
    puVar3 = &client;
    iVar1 = uv_udp_init();
    if (iVar1 != 0) goto LAB_0017c86f;
    puVar6 = &client;
    puVar3 = (uv_udp_t *)local_298;
    iVar1 = uv_udp_bind(&client,puVar3,0);
    if (iVar1 != 0) goto LAB_0017c874;
    puVar6 = &client;
    pcVar5 = alloc_cb;
    iVar1 = uv_udp_recv_start(&client,alloc_cb,recv_cb);
    puVar3 = (uv_udp_t *)pcVar5;
    if (iVar1 != 0) goto LAB_0017c879;
    local_2a8 = uv_buf_init("PING",4);
    puVar3 = &client;
    puVar6 = &local_148;
    in_RCX = 1;
    iVar1 = uv_udp_send(puVar6,&client,local_2a8,1,auStack_2b8,send_cb);
    if (iVar1 != 0) goto LAB_0017c87e;
    auVar7 = uv_buf_init("PANG",4);
    puVar3 = &client;
    puVar6 = (uv_udp_t *)(local_298 + 0x10);
    in_RCX = 1;
    local_2a8 = auVar7;
    iVar1 = uv_udp_send(puVar6,&client,local_2a8,1,auStack_2b8,send_cb);
    if (iVar1 != 0) goto LAB_0017c883;
    puVar6 = (uv_udp_t *)uv_default_loop();
    puVar3 = (uv_udp_t *)0x0;
    uv_run();
    if (send_cb_called != 2) goto LAB_0017c888;
    if (recv_cb_called != alloc_cb_called) goto LAB_0017c88d;
    if (timer_cb_called != 1) goto LAB_0017c892;
    if (close_cb_called != 2) goto LAB_0017c897;
    uVar2 = uv_default_loop();
    uv_walk(uVar2,close_walk_cb,0);
    puVar3 = (uv_udp_t *)0x0;
    uv_run(uVar2);
    puVar6 = (uv_udp_t *)uv_default_loop();
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_udp_send_unreachable_cold_1();
LAB_0017c860:
    run_test_udp_send_unreachable_cold_2();
LAB_0017c865:
    run_test_udp_send_unreachable_cold_3();
LAB_0017c86a:
    run_test_udp_send_unreachable_cold_4();
LAB_0017c86f:
    run_test_udp_send_unreachable_cold_5();
LAB_0017c874:
    run_test_udp_send_unreachable_cold_6();
LAB_0017c879:
    run_test_udp_send_unreachable_cold_7();
LAB_0017c87e:
    run_test_udp_send_unreachable_cold_8();
LAB_0017c883:
    run_test_udp_send_unreachable_cold_9();
LAB_0017c888:
    run_test_udp_send_unreachable_cold_10();
LAB_0017c88d:
    run_test_udp_send_unreachable_cold_11();
LAB_0017c892:
    run_test_udp_send_unreachable_cold_12();
LAB_0017c897:
    run_test_udp_send_unreachable_cold_13();
  }
  run_test_udp_send_unreachable_cold_14();
  if (puVar6 == (uv_udp_t *)&timer) {
    timer_cb_called = timer_cb_called + 1;
    uv_close(&client,close_cb);
    iVar1 = uv_close(&timer,close_cb);
    return iVar1;
  }
  timer_cb_cold_1();
  if (puVar6 == &client) {
    if (puVar3 < (uv_udp_t *)0x10001) {
      *extraout_RDX = alloc_cb::slab;
      extraout_RDX[1] = 0x10000;
      alloc_cb_called = alloc_cb_called + 1;
      return extraout_EAX;
    }
  }
  else {
    alloc_cb_cold_1();
  }
  alloc_cb_cold_2();
  if (puVar6 == &client) {
    recv_cb_called = recv_cb_called + 1;
    if ((long)puVar3 < 0) goto LAB_0017c949;
    if (puVar3 != (uv_udp_t *)0x0) {
      if (in_RCX != 0) {
        return extraout_EAX_00;
      }
      recv_cb_cold_2();
    }
    iVar1 = (int)puVar3;
    if (in_RCX == 0) {
      return extraout_EAX_00;
    }
  }
  else {
    recv_cb_cold_1();
LAB_0017c949:
    iVar1 = (int)puVar3;
    recv_cb_cold_4();
  }
  recv_cb_cold_3();
  if (puVar6 == (uv_udp_t *)0x0) {
    send_cb_cold_3();
  }
  else if (iVar1 == 0) {
    if ((uv_udp_t *)((anon_union_32_2_8d26fa8b_for_u *)&puVar6->u)->reserved[2] == &client) {
      send_cb_called = send_cb_called + 1;
      return extraout_EAX_01;
    }
    goto LAB_0017c97c;
  }
  send_cb_cold_1();
LAB_0017c97c:
  send_cb_cold_2();
  iVar1 = uv_is_closing();
  if (iVar1 == 1) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX_02;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 == 0) {
    iVar1 = uv_close(puVar6,0);
    return iVar1;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(udp_send_unreachable) {
  struct sockaddr_in addr;
  struct sockaddr_in addr2;
  uv_udp_send_t req1, req2;
  uv_buf_t buf;
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT_2, &addr2));

  r = uv_timer_init( uv_default_loop(), &timer );
  ASSERT(r == 0);

  r = uv_timer_start( &timer, timer_cb, 1000, 0 );
  ASSERT(r == 0);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  r = uv_udp_bind(&client, (const struct sockaddr*) &addr2, 0);
  ASSERT(r == 0);

  r = uv_udp_recv_start(&client, alloc_cb, recv_cb);
  ASSERT(r == 0);

  /* client sends "PING", then "PANG" */
  buf = uv_buf_init("PING", 4);

  r = uv_udp_send(&req1,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  send_cb);
  ASSERT(r == 0);

  buf = uv_buf_init("PANG", 4);

  r = uv_udp_send(&req2,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  send_cb);
  ASSERT(r == 0);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(send_cb_called == 2);
  ASSERT(recv_cb_called == alloc_cb_called);
  ASSERT(timer_cb_called == 1);
  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}